

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O2

void read_long_string(LexState *ls,SemInfo *seminfo,int sep)

{
  size_t sVar1;
  ZIO *pZVar2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  TString *pTVar7;
  char *pcVar8;
  
  uVar6 = ls->linenumber;
  save(ls,ls->current);
  pZVar2 = ls->z;
  sVar1 = pZVar2->n;
  pZVar2->n = pZVar2->n - 1;
  if (sVar1 == 0) {
    uVar4 = luaZ_fill(pZVar2);
  }
  else {
    pbVar3 = (byte *)pZVar2->p;
    pZVar2->p = (char *)(pbVar3 + 1);
    uVar4 = (uint)*pbVar3;
  }
  ls->current = uVar4;
  if ((uVar4 == 0xd) || (uVar4 == 10)) {
    inclinenumber(ls);
  }
  do {
    while( true ) {
      while ((iVar5 = ls->current, iVar5 == 10 || (iVar5 == 0xd))) {
        save(ls,10);
        inclinenumber(ls);
        if (seminfo == (SemInfo *)0x0) {
          ls->buff->n = 0;
        }
      }
      if (iVar5 == 0x5d) break;
      if (iVar5 == -1) {
        pcVar8 = "string";
        if (seminfo == (SemInfo *)0x0) {
          pcVar8 = "comment";
        }
        pcVar8 = luaO_pushfstring(ls->L,"unfinished long %s (starting at line %d)",pcVar8,
                                  (ulong)uVar6);
        lexerror(ls,pcVar8,0x121);
      }
      if (seminfo != (SemInfo *)0x0) {
        save(ls,iVar5);
      }
      pZVar2 = ls->z;
      sVar1 = pZVar2->n;
      pZVar2->n = pZVar2->n - 1;
      if (sVar1 == 0) {
        uVar4 = luaZ_fill(pZVar2);
      }
      else {
        pbVar3 = (byte *)pZVar2->p;
        pZVar2->p = (char *)(pbVar3 + 1);
        uVar4 = (uint)*pbVar3;
      }
      ls->current = uVar4;
    }
    iVar5 = skip_sep(ls);
  } while (iVar5 != sep);
  save(ls,ls->current);
  pZVar2 = ls->z;
  sVar1 = pZVar2->n;
  pZVar2->n = pZVar2->n - 1;
  if (sVar1 == 0) {
    uVar6 = luaZ_fill(pZVar2);
  }
  else {
    pbVar3 = (byte *)pZVar2->p;
    pZVar2->p = (char *)(pbVar3 + 1);
    uVar6 = (uint)*pbVar3;
  }
  ls->current = uVar6;
  if (seminfo != (SemInfo *)0x0) {
    pTVar7 = luaX_newstring(ls,ls->buff->buffer + (ulong)(uint)sep + 2,
                            ls->buff->n - (ulong)(sep * 2 + 4));
    seminfo->ts = pTVar7;
  }
  return;
}

Assistant:

static void read_long_string(LexState *ls, SemInfo *seminfo, int sep) {
    int line = ls->linenumber;  /* initial line (for error message) */
    save_and_next(ls);  /* skip 2nd '[' */
    if (currIsNewline(ls))  /* string starts with a newline? */
        inclinenumber(ls);  /* skip it */
    for (;;) {
        switch (ls->current) {
            case EOZ: {  /* error */
                const char *what = (seminfo ? "string" : "comment");
                const char *msg = luaO_pushfstring(ls->L,
                                                   "unfinished long %s (starting at line %d)", what, line);
                lexerror(ls, msg, TK_EOS);
                break;  /* to avoid warnings */
            }
            case ']': {
                if (skip_sep(ls) == sep) {
                    save_and_next(ls);  /* skip 2nd ']' */
                    goto endloop;
                }
                break;
            }
            case '\n':
            case '\r': {
                save(ls, '\n');
                inclinenumber(ls);
                if (!seminfo) luaZ_resetbuffer(ls->buff);  /* avoid wasting space */
                break;
            }
            default: {
                if (seminfo) save_and_next(ls);
                else
                    next(ls);
            }
        }
    }
    endloop:
    if (seminfo)
        seminfo->ts = luaX_newstring(ls, luaZ_buffer(ls->buff) + (2 + sep),
                                     luaZ_bufflen(ls->buff) - 2 * (2 + sep));
}